

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PFloat::WriteValue(PFloat *this,FArchive *ar,void *addr)

{
  float singleprecision;
  double doubleprecision;
  
  if (*(int *)&(this->super_PBasicType).super_PType.super_DObject.field_0x24 == 8) {
    doubleprecision = *addr;
    singleprecision = (float)doubleprecision;
    if ((doubleprecision != (double)singleprecision) ||
       (NAN(doubleprecision) || NAN((double)singleprecision))) {
      FArchive::WriteByte(ar,'\v');
      FArchive::operator<<(ar,&doubleprecision);
      return;
    }
  }
  else {
    singleprecision = *addr;
  }
  FArchive::WriteByte(ar,'\n');
  FArchive::operator<<(ar,&singleprecision);
  return;
}

Assistant:

void PFloat::WriteValue(FArchive &ar, const void *addr) const
{
	float singleprecision;
	if (Size == 8)
	{
		// If it can be written as single precision without information
		// loss, then prefer that over writing a full-sized double.
		double doubleprecision = *(double *)addr;
		singleprecision = (float)doubleprecision;
		if (singleprecision != doubleprecision)
		{
			ar.WriteByte(VAL_Float64);
			ar << doubleprecision;
			return;
		}
	}
	else
	{
		singleprecision = *(float *)addr;
	}
	ar.WriteByte(VAL_Float32);
	ar << singleprecision;
}